

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

TextureFormat deqp::gles31::Functional::FboTestUtil::getFramebufferReadFormat(TextureFormat *format)

{
  TextureChannelClass TVar1;
  TextureFormat *format_local;
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    tcu::TextureFormat::TextureFormat((TextureFormat *)&format_local,RGBA,UNORM_INT8);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    tcu::TextureFormat::TextureFormat((TextureFormat *)&format_local,RGBA,SIGNED_INT32);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    tcu::TextureFormat::TextureFormat((TextureFormat *)&format_local,RGBA,UNSIGNED_INT32);
    break;
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    tcu::TextureFormat::TextureFormat((TextureFormat *)&format_local,RGBA,FLOAT);
    break;
  default:
    tcu::TextureFormat::TextureFormat((TextureFormat *)&format_local);
  }
  return (TextureFormat)format_local;
}

Assistant:

tcu::TextureFormat getFramebufferReadFormat (const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32);

		default:
			DE_FATAL("Unknown format");
			return tcu::TextureFormat();
	}
}